

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O2

_Bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n,uint32_t *a,uint32_t *res)

{
  uint uVar1;
  uint b;
  uint32_t *n_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t i_1;
  uint uVar5;
  uint32_t *b_00;
  uint32_t i;
  uint uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  undefined8 local_648;
  undefined8 local_640;
  uint32_t n2 [128];
  uint32_t bn_zero [128];
  uint32_t local_238 [130];
  
  local_648 = res;
  memset(local_238,0,0x200);
  local_238[0] = 1;
  uVar1 = *n;
  uVar5 = 0;
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
    uVar3 = local_238[lVar7];
    uVar4 = n[lVar7];
    uVar2 = FStar_UInt32_eq_mask(uVar3,uVar4);
    uVar3 = FStar_UInt32_gte_mask(uVar3,uVar4);
    uVar5 = uVar5 & uVar2 | ~(uVar3 | uVar2);
  }
  b_00 = (uint32_t *)0x0;
  memset(bn_zero,0,0x200);
  uVar6 = 0xffffffff;
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
    b_00 = (uint32_t *)(ulong)bn_zero[lVar7];
    uVar3 = FStar_UInt32_eq_mask(a[lVar7],bn_zero[lVar7]);
    uVar6 = uVar6 & uVar3;
  }
  uVar8 = 0;
  local_640 = n;
  for (lVar7 = 0; n_00 = local_640, lVar7 != 0x80; lVar7 = lVar7 + 1) {
    uVar3 = a[lVar7];
    b = local_640[lVar7];
    uVar4 = FStar_UInt32_eq_mask(uVar3,b);
    b_00 = (uint32_t *)(ulong)b;
    uVar3 = FStar_UInt32_gte_mask(uVar3,b);
    uVar8 = uVar8 & uVar4 | ~(uVar3 | uVar4);
  }
  uVar8 = uVar5 & ~uVar6 & -(uVar1 & 1) & uVar8;
  uVar3 = Hacl_Bignum_Lib_bn_get_top_index_u32((uint32_t)local_640,b_00);
  if (uVar8 == 0xffffffff) {
    memset(n2,0,0x200);
    bVar9 = uVar1 < 2;
    n2[0] = uVar1 - 2;
    for (lVar7 = 0x10; lVar7 != 0x200; lVar7 = lVar7 + 0x10) {
      uVar1 = *(uint *)((long)n_00 + lVar7 + -0xc);
      *(uint *)((long)&local_648 + lVar7 + 4) = uVar1 - bVar9;
      uVar5 = *(uint *)((long)n_00 + lVar7 + -8);
      uVar6 = (uint)(uVar1 < bVar9);
      *(uint *)((long)n2 + lVar7 + -8) = uVar5 - uVar6;
      uVar1 = *(uint *)((long)n_00 + lVar7 + -4);
      uVar5 = (uint)(uVar5 < uVar6);
      *(uint *)((long)n2 + lVar7 + -4) = uVar1 - uVar5;
      uVar1 = (uint)(uVar1 < uVar5);
      bVar9 = *(uint *)((long)n_00 + lVar7) < uVar1;
      *(uint *)((long)n2 + lVar7) = *(uint *)((long)n_00 + lVar7) - uVar1;
    }
    n2[0x7d] = n_00[0x7d] - (uint)bVar9;
    uVar1 = (uint)(n_00[0x7d] < (uint)bVar9);
    n2[0x7e] = n_00[0x7e] - uVar1;
    n2[0x7f] = n_00[0x7f] - (uint)(n_00[0x7e] < uVar1);
    exp_vartime(uVar3 << 5,n_00,a,0x1000,n2,local_648);
  }
  else {
    memset(local_648,0,0x200);
  }
  return uVar8 == 0xffffffff;
}

Assistant:

bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n, uint32_t *a, uint32_t *res)
{
  uint32_t one[128U] = { 0U };
  memset(one, 0U, 128U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m1 = acc0;
  uint32_t m00 = m0 & m1;
  uint32_t bn_zero[128U] = { 0U };
  uint32_t mask = 0xFFFFFFFFU;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t uu____0 = FStar_UInt32_eq_mask(a[i], bn_zero[i]);
    mask = uu____0 & mask;
  }
  uint32_t mask1 = mask;
  uint32_t res10 = mask1;
  uint32_t m10 = res10;
  uint32_t acc = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m2 = acc;
  uint32_t is_valid_m = (m00 & ~m10) & m2;
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(128U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    uint32_t n2[128U] = { 0U };
    uint32_t c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(0U, n[0U], 2U, n2);
    uint32_t *a1 = n + 1U;
    uint32_t *res1 = n2 + 1U;
    uint32_t c = c0;
    for (uint32_t i = 0U; i < 31U; i++)
    {
      uint32_t t1 = a1[4U * i];
      uint32_t *res_i0 = res1 + 4U * i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i0);
      uint32_t t10 = a1[4U * i + 1U];
      uint32_t *res_i1 = res1 + 4U * i + 1U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t10, 0U, res_i1);
      uint32_t t11 = a1[4U * i + 2U];
      uint32_t *res_i2 = res1 + 4U * i + 2U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t11, 0U, res_i2);
      uint32_t t12 = a1[4U * i + 3U];
      uint32_t *res_i = res1 + 4U * i + 3U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t12, 0U, res_i);
    }
    KRML_MAYBE_FOR3(i,
      124U,
      127U,
      1U,
      uint32_t t1 = a1[i];
      uint32_t *res_i = res1 + i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i););
    uint32_t c1 = c;
    uint32_t c2 = c1;
    KRML_MAYBE_UNUSED_VAR(c2);
    exp_vartime(nBits, n, a, 4096U, n2, res);
  }
  else
  {
    memset(res, 0U, 128U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}